

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O1

void duckdb::DecimalRoundNegativePrecisionFunction<duckdb::hugeint_t,duckdb::Hugeint>
               (DataChunk *input,ExpressionState *state,Vector *result)

{
  ulong *puVar1;
  hugeint_t *phVar2;
  data_ptr_t pdVar3;
  unsigned_long *puVar4;
  sel_t *psVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  uint64_t uVar6;
  int64_t iVar7;
  reference pvVar8;
  byte bVar9;
  byte bVar10;
  bool bVar11;
  BoundFunctionExpression *pBVar12;
  pointer pFVar13;
  const_reference pvVar14;
  pointer pEVar15;
  long lVar16;
  TemplatedValidityData<unsigned_long> *pTVar17;
  idx_t idx_in_entry;
  ulong uVar18;
  ulong uVar19;
  int64_t *piVar20;
  ulong uVar21;
  ulong uVar22;
  hugeint_t hVar23;
  hugeint_t addition;
  hugeint_t local_108;
  idx_t local_f8;
  data_ptr_t local_f0;
  hugeint_t local_e8;
  reference local_d8;
  buffer_ptr<ValidityBuffer> *local_d0;
  hugeint_t local_c8;
  hugeint_t local_b8;
  hugeint_t local_a8;
  ulong local_98;
  data_ptr_t local_90;
  UnifiedVectorFormat local_88;
  ulong local_38;
  
  pBVar12 = BaseExpression::Cast<duckdb::BoundFunctionExpression>
                      (&state->expr->super_BaseExpression);
  pFVar13 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
            operator->(&pBVar12->bind_info);
  pvVar14 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::operator[](&pBVar12->children,0);
  pEVar15 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
            operator->(pvVar14);
  bVar9 = DecimalType::GetScale(&pEVar15->return_type);
  pvVar14 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::operator[](&pBVar12->children,0);
  pEVar15 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
            operator->(pvVar14);
  bVar10 = DecimalType::GetWidth(&pEVar15->return_type);
  if ((int)((uint)bVar9 - (uint)bVar10) < *(int *)&pFVar13[1]._vptr_FunctionData) {
    lVar16 = ((ulong)bVar9 - (long)*(int *)&pFVar13[1]._vptr_FunctionData) * 0x10;
    local_b8.lower = *(uint64_t *)(Hugeint::POWERS_OF_TEN + lVar16);
    local_b8.upper = *(int64_t *)(Hugeint::POWERS_OF_TEN + lVar16 + 8);
    lVar16 = (long)*(int *)&pFVar13[1]._vptr_FunctionData * -0x10;
    local_c8.lower = *(uint64_t *)(Hugeint::POWERS_OF_TEN + lVar16);
    local_c8.upper = *(int64_t *)(Hugeint::POWERS_OF_TEN + lVar16 + 8);
    hugeint_t::hugeint_t((hugeint_t *)&local_88,2);
    local_e8 = hugeint_t::operator/(&local_b8,(hugeint_t *)&local_88);
    local_d8 = vector<duckdb::Vector,_true>::operator[](&input->data,0);
    local_f8 = input->count;
    if (local_d8->vector_type == FLAT_VECTOR) {
      Vector::SetVectorType(result,FLAT_VECTOR);
      pvVar8 = local_d8;
      pdVar3 = result->data;
      local_f0 = local_d8->data;
      FlatVector::VerifyFlatVector(local_d8);
      FlatVector::VerifyFlatVector(result);
      puVar4 = (pvVar8->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar4 == (unsigned_long *)0x0) {
        if (local_f8 != 0) {
          lVar16 = 0;
          do {
            local_88.sel = *(SelectionVector **)(local_f0 + lVar16);
            local_88.data = *(data_ptr_t *)(local_f0 + lVar16 + 8);
            hugeint_t::hugeint_t(&local_108,0);
            bVar11 = hugeint_t::operator<((hugeint_t *)&local_88,&local_108);
            if (bVar11) {
              hugeint_t::operator-=((hugeint_t *)&local_88,&local_e8);
            }
            else {
              hugeint_t::operator+=((hugeint_t *)&local_88,&local_e8);
            }
            local_108 = hugeint_t::operator/((hugeint_t *)&local_88,&local_b8);
            hVar23 = hugeint_t::operator*(&local_108,&local_c8);
            *(uint64_t *)(pdVar3 + lVar16) = hVar23.lower;
            *(int64_t *)(pdVar3 + lVar16 + 8) = hVar23.upper;
            lVar16 = lVar16 + 0x10;
            local_f8 = local_f8 - 1;
          } while (local_f8 != 0);
        }
      }
      else {
        (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask = puVar4;
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                   &(pvVar8->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
             (pvVar8->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
        if (0x3f < local_f8 + 0x3f) {
          local_98 = local_f8 + 0x3f >> 6;
          local_38 = 0;
          uVar18 = 0;
          local_90 = pdVar3;
          do {
            pdVar3 = local_90;
            puVar4 = (local_d8->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar4 == (unsigned_long *)0x0) {
              uVar19 = 0xffffffffffffffff;
            }
            else {
              uVar19 = puVar4[local_38];
            }
            uVar22 = uVar18 + 0x40;
            if (local_f8 <= uVar18 + 0x40) {
              uVar22 = local_f8;
            }
            uVar21 = uVar22;
            if (uVar19 != 0) {
              uVar21 = uVar18;
              if (uVar19 == 0xffffffffffffffff) {
                if (uVar18 < uVar22) {
                  lVar16 = uVar18 << 4;
                  do {
                    local_88.sel = *(SelectionVector **)(local_f0 + lVar16);
                    local_88.data = *(data_ptr_t *)(local_f0 + lVar16 + 8);
                    hugeint_t::hugeint_t(&local_108,0);
                    bVar11 = hugeint_t::operator<((hugeint_t *)&local_88,&local_108);
                    if (bVar11) {
                      hugeint_t::operator-=((hugeint_t *)&local_88,&local_e8);
                    }
                    else {
                      hugeint_t::operator+=((hugeint_t *)&local_88,&local_e8);
                    }
                    local_108 = hugeint_t::operator/((hugeint_t *)&local_88,&local_b8);
                    hVar23 = hugeint_t::operator*(&local_108,&local_c8);
                    *(uint64_t *)(pdVar3 + lVar16) = hVar23.lower;
                    *(int64_t *)(pdVar3 + lVar16 + 8) = hVar23.upper;
                    uVar18 = uVar18 + 1;
                    lVar16 = lVar16 + 0x10;
                    uVar21 = uVar18;
                  } while (uVar22 != uVar18);
                }
              }
              else {
                local_d0 = (buffer_ptr<ValidityBuffer> *)(uVar18 - uVar22);
                if (uVar18 < uVar22) {
                  lVar16 = uVar18 << 4;
                  uVar21 = 0;
                  do {
                    if ((uVar19 >> (uVar21 & 0x3f) & 1) != 0) {
                      local_88.sel = *(SelectionVector **)(local_f0 + lVar16);
                      local_88.data = *(data_ptr_t *)(local_f0 + lVar16 + 8);
                      hugeint_t::hugeint_t(&local_108,0);
                      bVar11 = hugeint_t::operator<((hugeint_t *)&local_88,&local_108);
                      if (bVar11) {
                        hugeint_t::operator-=((hugeint_t *)&local_88,&local_e8);
                      }
                      else {
                        hugeint_t::operator+=((hugeint_t *)&local_88,&local_e8);
                      }
                      local_108 = hugeint_t::operator/((hugeint_t *)&local_88,&local_b8);
                      hVar23 = hugeint_t::operator*(&local_108,&local_c8);
                      *(uint64_t *)(local_90 + lVar16) = hVar23.lower;
                      *(int64_t *)(local_90 + lVar16 + 8) = hVar23.upper;
                    }
                    uVar21 = uVar21 + 1;
                    lVar16 = lVar16 + 0x10;
                  } while ((long)&(local_d0->internal).
                                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr + uVar21 != 0);
                  uVar21 = uVar18 + uVar21;
                }
              }
            }
            local_38 = local_38 + 1;
            uVar18 = uVar21;
          } while (local_38 != local_98);
        }
      }
    }
    else if (local_d8->vector_type == CONSTANT_VECTOR) {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
      phVar2 = (hugeint_t *)result->data;
      pdVar3 = local_d8->data;
      puVar4 = (local_d8->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar4 == (unsigned_long *)0x0) || ((*puVar4 & 1) != 0)) {
        ConstantVector::SetNull(result,false);
        local_88.sel = *(SelectionVector **)pdVar3;
        local_88.data = *(data_ptr_t *)(pdVar3 + 8);
        hugeint_t::hugeint_t(&local_108,0);
        bVar11 = hugeint_t::operator<((hugeint_t *)&local_88,&local_108);
        if (bVar11) {
          hugeint_t::operator-=((hugeint_t *)&local_88,&local_e8);
        }
        else {
          hugeint_t::operator+=((hugeint_t *)&local_88,&local_e8);
        }
        local_108 = hugeint_t::operator/((hugeint_t *)&local_88,&local_b8);
        hVar23 = hugeint_t::operator*(&local_108,&local_c8);
        *phVar2 = hVar23;
      }
      else {
        ConstantVector::SetNull(result,true);
      }
    }
    else {
      UnifiedVectorFormat::UnifiedVectorFormat(&local_88);
      Vector::ToUnifiedFormat(local_d8,local_f8,&local_88);
      Vector::SetVectorType(result,FLAT_VECTOR);
      pdVar3 = result->data;
      local_f0 = local_88.data;
      FlatVector::VerifyFlatVector(result);
      if (local_88.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        if (local_f8 != 0) {
          psVar5 = (local_88.sel)->sel_vector;
          piVar20 = (int64_t *)(pdVar3 + 8);
          uVar18 = 0;
          do {
            uVar19 = uVar18;
            if (psVar5 != (sel_t *)0x0) {
              uVar19 = (ulong)psVar5[uVar18];
            }
            local_108 = *(hugeint_t *)(local_f0 + uVar19 * 0x10);
            hugeint_t::hugeint_t(&local_a8,0);
            bVar11 = hugeint_t::operator<(&local_108,&local_a8);
            if (bVar11) {
              hugeint_t::operator-=(&local_108,&local_e8);
            }
            else {
              hugeint_t::operator+=(&local_108,&local_e8);
            }
            local_a8 = hugeint_t::operator/(&local_108,&local_b8);
            hVar23 = hugeint_t::operator*(&local_a8,&local_c8);
            piVar20[-1] = hVar23.lower;
            *piVar20 = hVar23.upper;
            uVar18 = uVar18 + 1;
            piVar20 = piVar20 + 2;
          } while (local_f8 != uVar18);
        }
      }
      else if (local_f8 != 0) {
        psVar5 = (local_88.sel)->sel_vector;
        local_d0 = &(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
        piVar20 = (int64_t *)(pdVar3 + 8);
        uVar18 = 0;
        do {
          uVar19 = uVar18;
          if (psVar5 != (sel_t *)0x0) {
            uVar19 = (ulong)psVar5[uVar18];
          }
          if ((local_88.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
               [uVar19 >> 6] >> (uVar19 & 0x3f) & 1) == 0) {
            if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              local_a8.lower =
                   (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_108,&local_a8.lower);
              uVar6 = local_108.lower;
              iVar7 = local_108.upper;
              local_108 = (hugeint_t)ZEXT816(0);
              this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                     internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)uVar6;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)iVar7;
              if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108.upper !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108.upper);
              }
              pTVar17 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (local_d0);
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   (unsigned_long *)
                   (pTVar17->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>;
            }
            bVar9 = (byte)uVar18 & 0x3f;
            puVar1 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                     (uVar18 >> 6);
            *puVar1 = *puVar1 & (-2L << bVar9 | 0xfffffffffffffffeU >> 0x40 - bVar9);
          }
          else {
            local_108 = *(hugeint_t *)(local_f0 + uVar19 * 0x10);
            hugeint_t::hugeint_t(&local_a8,0);
            bVar11 = hugeint_t::operator<(&local_108,&local_a8);
            if (bVar11) {
              hugeint_t::operator-=(&local_108,&local_e8);
            }
            else {
              hugeint_t::operator+=(&local_108,&local_e8);
            }
            local_a8 = hugeint_t::operator/(&local_108,&local_b8);
            hVar23 = hugeint_t::operator*(&local_a8,&local_c8);
            piVar20[-1] = hVar23.lower;
            *piVar20 = hVar23.upper;
          }
          uVar18 = uVar18 + 1;
          piVar20 = piVar20 + 2;
        } while (local_f8 != uVar18);
      }
      if (local_88.owned_sel.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_88.owned_sel.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_88.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_88.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
    }
  }
  else {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    Value::INTEGER((Value *)&local_88,0);
    Vector::SetValue(result,0,(Value *)&local_88);
    Value::~Value((Value *)&local_88);
  }
  return;
}

Assistant:

static void DecimalRoundNegativePrecisionFunction(DataChunk &input, ExpressionState &state, Vector &result) {
	auto &func_expr = state.expr.Cast<BoundFunctionExpression>();
	auto &info = func_expr.bind_info->Cast<RoundPrecisionFunctionData>();
	auto source_scale = DecimalType::GetScale(func_expr.children[0]->return_type);
	auto width = DecimalType::GetWidth(func_expr.children[0]->return_type);
	if (info.target_scale <= -int32_t(width - source_scale)) {
		// scale too big for width
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
		result.SetValue(0, Value::INTEGER(0));
		return;
	}
	T divide_power_of_ten = UnsafeNumericCast<T>(POWERS_OF_TEN_CLASS::POWERS_OF_TEN[-info.target_scale + source_scale]);
	T multiply_power_of_ten = UnsafeNumericCast<T>(POWERS_OF_TEN_CLASS::POWERS_OF_TEN[-info.target_scale]);
	T addition = divide_power_of_ten / 2;

	UnaryExecutor::Execute<T, T>(input.data[0], result, input.size(), [&](T input) {
		if (input < 0) {
			input -= addition;
		} else {
			input += addition;
		}
		return UnsafeNumericCast<T>(input / divide_power_of_ten * multiply_power_of_ten);
	});
}